

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.h
# Opt level: O0

void __thiscall AI::Task::Task(Task *this,string *debugName,TaskType type)

{
  TaskType type_local;
  string *debugName_local;
  Task *this_local;
  
  Condition::Condition(&this->preconditions);
  Condition::Condition(&this->postconditions);
  Condition::Condition(&this->breakConditions);
  this->type = type;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::vector(&this->subtasks);
  this->parentTaskIndex = -1;
  this->maxRepeats = 0;
  this->remainingRepeats = 0;
  std::
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::map(&this->modifiedFlags);
  std::
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::map(&this->modifiedValues);
  std::
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::map(&this->modifiedVectors);
  this->identifier = Null;
  std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::function
            (&this->setup);
  std::function<void_(AI::WorldState_&,_AI::Task_&)>::function(&this->finish);
  std::function<void_(AI::WorldState_&)>::function(&this->finally);
  std::function<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&)>::function
            (&this->loop);
  std::__cxx11::string::string((string *)&this->debugName,(string *)debugName);
  this->isImmediate = false;
  this->isLastInCompound = false;
  this->failed = false;
  TaskParameters::TaskParameters(&this->parameters);
  return;
}

Assistant:

Task(std::string debugName, TaskType type = TaskType::Simple)
			: type{type}, debugName{debugName}
			{}